

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<float> __thiscall wasm::WATParser::Lexer::takeF32(Lexer *this)

{
  bool bVar1;
  uint uVar2;
  LexFloatResult *pLVar3;
  unsigned_long *puVar4;
  LexIntResult *pLVar5;
  size_type sVar6;
  float local_dc;
  ulong local_d8;
  float local_c4;
  float local_c0;
  float local_bc;
  string_view local_b8;
  undefined1 local_a8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result_1;
  uint32_t bits;
  uint64_t payload;
  undefined1 auStack_68 [4];
  float f;
  undefined1 local_58 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> result;
  uint64_t nanDefault;
  uint32_t payloadMask;
  int signif;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
  _M_engaged = false;
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexFloatResult>.
  _41_7_ = 0x4000;
  _auStack_68 = next(this);
  anon_unknown_0::float_
            ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)local_58,
             _auStack_68);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar1) {
    pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)local_58
                       );
    payload._4_4_ = (float)pLVar3->d;
    uVar2 = std::isnan((double)(ulong)(uint)payload._4_4_);
    if ((uVar2 & 1) != 0) {
      pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                          local_58);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&pLVar3->nanPayload);
      if (bVar1) {
        pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::operator->
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                            local_58);
        puVar4 = std::optional<unsigned_long>::operator*(&pLVar3->nanPayload);
        local_d8 = *puVar4;
      }
      else {
        local_d8 = 0x400000;
      }
      if ((local_d8 == 0) || (0x7fffff < local_d8)) {
        std::optional<float>::optional((optional<float> *)&this_local);
        return (_Optional_base<float,_true,_true>)(_Optional_base<float,_true,_true>)this_local;
      }
      result_1.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _32_4_ = (uint)payload._4_4_ & 0xff800000 | (uint)local_d8;
      payload._4_4_ =
           (float)result_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                  ._32_4_;
    }
    pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)local_58
                       );
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)pLVar3);
    this->pos = sVar6 + this->pos;
    advance(this);
    std::optional<float>::optional<float,_true>
              ((optional<float> *)&this_local,(float *)((long)&payload + 4));
  }
  else {
    local_b8 = next(this);
    anon_unknown_0::integer
              ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_a8,local_b8);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_a8);
    if (bVar1) {
      pLVar5 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_a8
                         );
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)pLVar5);
      this->pos = sVar6 + this->pos;
      advance(this);
      pLVar5 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_a8
                         );
      if (pLVar5->sign == Neg) {
        pLVar5 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                            local_a8);
        if (pLVar5->n == 0) {
          local_bc = -0.0;
          std::optional<float>::optional<float,_true>((optional<float> *)&this_local,&local_bc);
        }
        else {
          pLVar5 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                             ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                              local_a8);
          local_c0 = (float)(long)pLVar5->n;
          std::optional<float>::optional<float,_true>((optional<float> *)&this_local,&local_c0);
        }
      }
      else {
        pLVar5 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                            local_a8);
        local_dc = (float)pLVar5->n;
        local_c4 = local_dc;
        std::optional<float>::optional<float,_true>((optional<float> *)&this_local,&local_c4);
      }
    }
    else {
      std::optional<float>::optional((optional<float> *)&this_local);
    }
  }
  return (_Optional_base<float,_true,_true>)(_Optional_base<float,_true,_true>)this_local;
}

Assistant:

std::optional<float> Lexer::takeF32() {
  constexpr int signif = 23;
  constexpr uint32_t payloadMask = (1u << signif) - 1;
  constexpr uint64_t nanDefault = 1ull << (signif - 1);
  if (auto result = float_(next())) {
    float f = result->d;
    if (std::isnan(f)) {
      // Validate and inject payload.
      uint64_t payload = result->nanPayload ? *result->nanPayload : nanDefault;
      if (payload == 0 || payload > payloadMask) {
        // TODO: Add error production for out-of-bounds payload.
        return std::nullopt;
      }
      uint32_t bits;
      static_assert(sizeof(bits) == sizeof(f));
      memcpy(&bits, &f, sizeof(bits));
      bits = (bits & ~payloadMask) | payload;
      memcpy(&f, &bits, sizeof(bits));
    }
    pos += result->span.size();
    advance();
    return f;
  }
  if (auto result = integer(next())) {
    pos += result->span.size();
    advance();
    if (result->sign == Neg) {
      if (result->n == 0) {
        return -0.0f;
      }
      return float(int64_t(result->n));
    }
    return float(result->n);
  }
  return std::nullopt;
}